

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pPerformanceTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::PerformanceTests::init(PerformanceTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  
  pTVar2 = (TestNode *)operator_new(0x78);
  BlendTests::BlendTests((BlendTests *)pTVar2,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"texture","Texture Performance Tests");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0214a818;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"shader","Shader Performance Tests");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0214a868;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  ShaderCompilerTests::ShaderCompilerTests
            ((ShaderCompilerTests *)pTVar2,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"api","API Performance Tests");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0214a8b8;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"buffer","Buffer Performance Tests");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0214a908;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  DepthTests::DepthTests((DepthTests *)pTVar2,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void PerformanceTests::init (void)
{
	addChild(new BlendTests				(m_context));
	addChild(new TextureTestGroup		(m_context));
	addChild(new ShadersTestGroup		(m_context));
	addChild(new ShaderCompilerTests	(m_context));
	addChild(new APITests				(m_context));
	addChild(new BufferTestGroup		(m_context));
	addChild(new DepthTests				(m_context));
}